

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5LocaleFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  void *pvVar1;
  undefined8 uVar2;
  int iVar3;
  int n;
  uchar *__src;
  uchar *z;
  undefined8 *z_00;
  int n_00;
  size_t __n;
  
  __src = sqlite3_value_text(*apArg);
  iVar3 = sqlite3_value_bytes(*apArg);
  z = sqlite3_value_text(apArg[1]);
  n = sqlite3_value_bytes(apArg[1]);
  if ((__src != (uchar *)0x0) && (*__src != '\0')) {
    pvVar1 = pCtx->pFunc->pUserData;
    n_00 = n + iVar3 + 0x11;
    z_00 = (undefined8 *)sqlite3_malloc(n_00);
    if (z_00 != (undefined8 *)0x0) {
      uVar2 = *(undefined8 *)((long)pvVar1 + 0x68);
      *z_00 = *(undefined8 *)((long)pvVar1 + 0x60);
      z_00[1] = uVar2;
      __n = (size_t)iVar3;
      memcpy(z_00 + 2,__src,__n);
      *(undefined1 *)((long)z_00 + __n + 0x10) = 0;
      if (z != (uchar *)0x0) {
        memcpy((void *)((long)z_00 + __n + 0x11),z,(long)n);
      }
      sqlite3_result_blob(pCtx,z_00,n_00,sqlite3_free);
      return;
    }
    sqlite3_result_error_nomem(pCtx);
    return;
  }
  sqlite3_result_text(pCtx,(char *)z,n,(_func_void_void_ptr *)0xffffffffffffffff);
  return;
}

Assistant:

static void fts5LocaleFunc(
  sqlite3_context *pCtx,          /* Function call context */
  int nArg,                       /* Number of args */
  sqlite3_value **apArg           /* Function arguments */
){
  const char *zLocale = 0;
  int nLocale = 0;
  const char *zText = 0;
  int nText = 0;

  assert( nArg==2 );
  UNUSED_PARAM(nArg);

  zLocale = (const char*)sqlite3_value_text(apArg[0]);
  nLocale = sqlite3_value_bytes(apArg[0]);

  zText = (const char*)sqlite3_value_text(apArg[1]);
  nText = sqlite3_value_bytes(apArg[1]);

  if( zLocale==0 || zLocale[0]=='\0' ){
    sqlite3_result_text(pCtx, zText, nText, SQLITE_TRANSIENT);
  }else{
    Fts5Global *p = (Fts5Global*)sqlite3_user_data(pCtx);
    u8 *pBlob = 0;
    u8 *pCsr = 0;
    int nBlob = 0;

    nBlob = FTS5_LOCALE_HDR_SIZE + nLocale + 1 + nText;
    pBlob = (u8*)sqlite3_malloc(nBlob);
    if( pBlob==0 ){
      sqlite3_result_error_nomem(pCtx);
      return;
    }

    pCsr = pBlob;
    memcpy(pCsr, (const u8*)p->aLocaleHdr, FTS5_LOCALE_HDR_SIZE);
    pCsr += FTS5_LOCALE_HDR_SIZE;
    memcpy(pCsr, zLocale, nLocale);
    pCsr += nLocale;
    (*pCsr++) = 0x00;
    if( zText ) memcpy(pCsr, zText, nText);
    assert( &pCsr[nText]==&pBlob[nBlob] );

    sqlite3_result_blob(pCtx, pBlob, nBlob, sqlite3_free);
  }
}